

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopll.c
# Opt level: O0

void OPLL_EnvelopeGenerate(opll_t *chip)

{
  undefined1 uVar1;
  uint32_t uVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  bool local_60;
  bool local_5f;
  bool local_5e;
  bool local_5d;
  bool local_5c;
  bool local_5b;
  bool local_5a;
  bool local_59;
  uint local_58;
  uint8_t i1_1;
  uint8_t i0_1;
  uint8_t i1;
  uint8_t i0;
  int32_t shift;
  uint32_t mcsel;
  int32_t sl;
  int32_t step;
  uint8_t next_state;
  uint8_t state;
  uint8_t zero;
  int32_t next_level;
  int32_t level;
  uint8_t local_14;
  uint8_t rate_lo;
  uint8_t rate_hi;
  uint8_t sum;
  uint8_t ksr;
  uint8_t state_rate;
  uint8_t rate;
  uint8_t timer_low;
  uint8_t timer_bit;
  uint8_t timer_inc;
  opll_t *chip_local;
  
  uVar6 = (chip->cycles + 1) / 3 & 1;
  if ((chip->eg_counter_state & 3) == 3) {
    if (chip->cycles == 0) {
      rate_lo = '\x01';
    }
    else {
      rate_lo = chip->eg_timer_carry;
    }
  }
  else {
    rate_lo = '\0';
  }
  uVar2 = chip->eg_timer;
  bVar3 = ((byte)chip->eg_timer & 1) + rate_lo;
  chip->eg_timer_carry = (uint8_t)((int)(uint)bVar3 >> 1);
  chip->eg_timer = (bVar3 & 1) << 0x11 | chip->eg_timer >> 1;
  if ((chip->testmode & 8) != 0) {
    chip->eg_timer = chip->eg_timer & 0x2ffff;
    chip->eg_timer = (chip->write_data & 4) << 0xe | chip->eg_timer;
  }
  if ((chip->eg_timer_shift_stop == '\0') && ((chip->eg_timer >> 0x10 & 1) != 0)) {
    chip->eg_timer_shift = (uint8_t)chip->cycles;
  }
  if ((chip->cycles == 0) && ((chip->eg_counter_state_prev & 1) == 1)) {
    chip->eg_timer_low_lock = (byte)uVar2 & 3;
    chip->eg_timer_shift_lock = chip->eg_timer_shift;
    if (0xd < chip->eg_timer_shift_lock) {
      chip->eg_timer_shift_lock = '\0';
    }
    chip->eg_timer_shift = '\0';
  }
  chip->eg_timer_shift_stop = chip->eg_timer_shift_stop | (byte)(chip->eg_timer >> 0x10) & 1;
  if (chip->cycles == 0) {
    chip->eg_timer_shift_stop = '\0';
  }
  chip->eg_counter_state_prev = chip->eg_counter_state;
  if (chip->cycles == 0x11) {
    chip->eg_counter_state = chip->eg_counter_state + '\x01';
  }
  step._0_1_ = chip->eg_level[(ulong)(chip->cycles + 0x10) % 0x12];
  uVar7 = (uint)(byte)step;
  chip->eg_silent = uVar7 == 0x7f;
  if (((chip->eg_state[(ulong)(chip->cycles + 0x10) % 0x12] != '\0') && ((chip->eg_off & 2) != 0))
     && ((chip->eg_dokon & 2) == 0)) {
    step._0_1_ = 0x7f;
  }
  if ((chip->eg_maxrate != '\0') && ((chip->eg_dokon & 2) != 0)) {
    step._0_1_ = 0;
  }
  bVar3 = chip->eg_state[chip->cycles + 0x10 + ((chip->cycles + 0x10) / 0x12) * -0x12];
  sl._1_1_ = 0;
  mcsel._0_1_ = 0;
  bVar5 = (byte)mcsel;
  mcsel._0_1_ = 0;
  bVar4 = (byte)mcsel;
  mcsel._0_1_ = 0;
  uVar8 = (uint)bVar3;
  if (uVar8 == 0) {
    mcsel._0_1_ = bVar4;
    if (((chip->eg_maxrate == '\0') && ((chip->eg_kon & 2) != 0)) && (uVar7 != 0)) {
      if (chip->eg_rate_hi < 0xc) {
        local_58 = (uint)chip->eg_inc_lo;
      }
      else {
        local_58 = (chip->eg_rate_hi - 0xb) + (uint)chip->eg_inc_hi;
      }
      mcsel._0_1_ = bVar5;
      if (0 < (int)local_58) {
        mcsel._0_1_ = (byte)((int)(uVar7 ^ 0xffffffff) >> (5U - (char)local_58 & 0x1f));
      }
    }
    sl._1_1_ = uVar7 == 0;
  }
  else if (uVar8 == 1) {
    mcsel._0_1_ = bVar4;
    if ((((chip->eg_off & 2) == 0) && ((chip->eg_dokon & 2) == 0)) &&
       ((int)uVar7 >> 3 != (uint)chip->eg_sl)) {
      local_59 = true;
      if (chip->eg_rate_hi != '\x0f') {
        local_5a = false;
        if (chip->eg_rate_hi == '\x0e') {
          local_5a = chip->eg_inc_hi != '\0';
        }
        local_59 = local_5a;
      }
      if (((((chip->eg_rate_hi != '\x0e') || (local_5b = true, chip->eg_inc_hi != '\0')) &&
           ((chip->eg_rate_hi != '\r' || (local_5b = true, chip->eg_inc_hi == '\0')))) &&
          (((chip->eg_rate_hi != '\r' || (chip->eg_inc_hi != '\0')) ||
           (local_5b = true, (chip->eg_counter_state_prev & 1) == 0)))) &&
         ((((chip->eg_rate_hi != '\f' || (chip->eg_inc_hi == '\0')) ||
           (local_5b = true, (chip->eg_counter_state_prev & 1) == 0)) &&
          (((chip->eg_rate_hi != '\f' || (chip->eg_inc_hi != '\0')) ||
           (local_5b = true, (chip->eg_counter_state_prev & 3) != 3)))))) {
        local_5c = false;
        if (chip->eg_inc_lo != '\0') {
          local_5c = (chip->eg_counter_state_prev & 3) == 3;
        }
        local_5b = local_5c;
      }
      mcsel._0_1_ = local_59 << 1 | local_5b;
    }
    if ((int)uVar7 >> 3 == (uint)chip->eg_sl) {
      sl._1_1_ = 2;
    }
    else {
      sl._1_1_ = 1;
    }
  }
  else if (((uVar8 - 2 < 2) && (sl._1_1_ = bVar3, mcsel._0_1_ = bVar4, (chip->eg_off & 2) == 0)) &&
          ((chip->eg_dokon & 2) == 0)) {
    local_5d = true;
    if (chip->eg_rate_hi != '\x0f') {
      local_5e = false;
      if (chip->eg_rate_hi == '\x0e') {
        local_5e = chip->eg_inc_hi != '\0';
      }
      local_5d = local_5e;
    }
    if ((((chip->eg_rate_hi != '\x0e') || (local_5f = true, chip->eg_inc_hi != '\0')) &&
        ((((chip->eg_rate_hi != '\r' || (local_5f = true, chip->eg_inc_hi == '\0')) &&
          (((chip->eg_rate_hi != '\r' || (chip->eg_inc_hi != '\0')) ||
           (local_5f = true, (chip->eg_counter_state_prev & 1) == 0)))) &&
         (((chip->eg_rate_hi != '\f' || (chip->eg_inc_hi == '\0')) ||
          (local_5f = true, (chip->eg_counter_state_prev & 1) == 0)))))) &&
       (((chip->eg_rate_hi != '\f' || (chip->eg_inc_hi != '\0')) ||
        (local_5f = true, (chip->eg_counter_state_prev & 3) != 3)))) {
      local_60 = false;
      if (chip->eg_inc_lo != '\0') {
        local_60 = (chip->eg_counter_state_prev & 3) == 3;
      }
      local_5f = local_60;
    }
    mcsel._0_1_ = local_5d << 1 | local_5f;
  }
  if ((chip->eg_kon & 2) == 0) {
    sl._1_1_ = 3;
  }
  if ((chip->eg_dokon & 2) != 0) {
    sl._1_1_ = 0;
  }
  chip->eg_level[(ulong)(chip->cycles + 0x10) % 0x12] = (byte)step + (byte)mcsel;
  chip->eg_state[(ulong)(chip->cycles + 0x10) % 0x12] = sl._1_1_;
  bVar3 = (byte)((int)(uint)chip->eg_rate >> 2);
  bVar4 = chip->eg_rate & 3;
  chip->eg_inc_hi = (uint8_t)eg_stephi[bVar4][chip->eg_timer_low_lock];
  bVar5 = chip->eg_timer_shift_lock + bVar3 & 0xf;
  chip->eg_inc_lo = '\0';
  if ((bVar3 < 0xc) && (chip->eg_zerorate == '\0')) {
    if (bVar5 == 0xc) {
      chip->eg_inc_lo = '\x01';
    }
    else if (bVar5 == 0xd) {
      chip->eg_inc_lo = (uint8_t)((int)(uint)bVar4 >> 1);
    }
    else if (bVar5 == 0xe) {
      chip->eg_inc_lo = chip->eg_rate & 1;
    }
  }
  chip->eg_maxrate = bVar3 == 0xf;
  chip->eg_rate_hi = bVar3;
  chip->eg_kon = chip->eg_kon * '\x02';
  chip->eg_kon = chip->eg_kon | chip->kon[ch_offset[chip->cycles]];
  chip->eg_off = chip->eg_off * '\x02';
  uVar1 = chip->eg_off;
  chip->eg_off = uVar1 | chip->eg_level[chip->cycles] >> 2 == 0x1f;
  switch(chip->rm_select) {
  case 0:
  case 3:
    chip->eg_kon = chip->eg_kon | (byte)((int)(uint)chip->rhythm >> 4) & 1;
    break;
  case 1:
    chip->eg_kon = chip->eg_kon | chip->rhythm & 1;
    break;
  case 2:
    chip->eg_kon = chip->eg_kon | (byte)((int)(uint)chip->rhythm >> 2) & 1;
    break;
  case 4:
    chip->eg_kon = chip->eg_kon | (byte)((int)(uint)chip->rhythm >> 3) & 1;
    break;
  case 5:
    chip->eg_kon = chip->eg_kon | (byte)((int)(uint)chip->rhythm >> 1) & 1;
  }
  local_14 = '\0';
  chip->eg_dokon = chip->eg_dokon << 1;
  level._3_1_ = chip->eg_state[chip->cycles];
  if (((level._3_1_ == '\x03') && ((chip->eg_kon & 1) != 0)) && ((chip->eg_off & 1) != 0)) {
    level._3_1_ = '\0';
    chip->eg_dokon = chip->eg_dokon | 1;
  }
  switch(level._3_1_) {
  case '\0':
    local_14 = chip->c_adrr[0];
    break;
  case '\x01':
    local_14 = chip->c_adrr[1];
    break;
  case '\x02':
    if (chip->c_et == '\0') {
      local_14 = chip->c_adrr[2];
    }
    break;
  case '\x03':
    if (chip->son[ch_offset[chip->cycles]] == '\0') {
      local_14 = chip->c_adrr[2];
    }
    else {
      local_14 = '\x05';
    }
  }
  if ((((chip->eg_kon & 1) == 0) && (uVar6 == 0)) &&
     ((chip->rm_select != 2 && (chip->rm_select != 1)))) {
    local_14 = '\0';
  }
  if ((((chip->eg_kon & 1) != 0) && (chip->eg_state[chip->cycles] == '\x03')) &&
     ((chip->eg_off & 1) == 0)) {
    local_14 = '\f';
  }
  if (((((chip->eg_kon & 1) == 0) && (chip->son[ch_offset[chip->cycles]] == '\0')) && (uVar6 == 1))
     && (chip->c_et == '\0')) {
    local_14 = '\a';
  }
  chip->eg_zerorate = local_14 == '\0';
  level._2_1_ = chip->c_ksr_freq;
  if (chip->c_ksr == '\0') {
    level._2_1_ = (byte)((int)(uint)level._2_1_ >> 2);
  }
  chip->eg_rate = local_14 * '\x04' + level._2_1_;
  if ((chip->eg_rate & 0x40) != 0) {
    chip->eg_rate = level._2_1_ & 3 | 0x3c;
  }
  chip->eg_sl = (ushort)chip->c_sl;
  return;
}

Assistant:

static void OPLL_EnvelopeGenerate(opll_t *chip) {
    uint8_t timer_inc;
    uint8_t timer_bit;
    uint8_t timer_low;
    uint8_t rate;
    uint8_t state_rate;
    uint8_t ksr;
    uint8_t sum;
    uint8_t rate_hi;
    uint8_t rate_lo;
    int32_t level;
    int32_t next_level;
    uint8_t zero;
    uint8_t state;
    uint8_t next_state;
    int32_t step;
    int32_t sl;
    uint32_t mcsel = ((chip->cycles + 1) / 3) & 0x01;


    /* EG timer */
    if ((chip->eg_counter_state & 3) != 3) {
        timer_inc = 0;
    } else if (chip->cycles == 0) {
        timer_inc = 1;
    } else {
        timer_inc = chip->eg_timer_carry;
    }
    timer_low = chip->eg_timer & 3;
    timer_bit = chip->eg_timer & 1;
    timer_bit += timer_inc;
    chip->eg_timer_carry = timer_bit >> 1;
    chip->eg_timer = ((timer_bit & 1) << 17) | (chip->eg_timer >> 1);
    if (chip->testmode & 0x08) {
        chip->eg_timer &= 0x2ffff;
        chip->eg_timer |= (chip->write_data << (16 - 2)) & 0x10000;
    }
    if (!chip->eg_timer_shift_stop && ((chip->eg_timer >> 16) & 1)) {
        chip->eg_timer_shift = chip->cycles;
    }
    if (chip->cycles == 0 && (chip->eg_counter_state_prev & 1) == 1) {
        chip->eg_timer_low_lock = timer_low;
        chip->eg_timer_shift_lock = chip->eg_timer_shift;
        if (chip->eg_timer_shift_lock > 13)
            chip->eg_timer_shift_lock = 0;

        chip->eg_timer_shift = 0;
    }
    chip->eg_timer_shift_stop |= (chip->eg_timer >> 16) & 1;
    if (chip->cycles == 0) {
        chip->eg_timer_shift_stop = 0;
    }
    chip->eg_counter_state_prev = chip->eg_counter_state;
    if (chip->cycles == 17) {
        chip->eg_counter_state++;
    }

    level = chip->eg_level[(chip->cycles+16)%18];
    next_level = level;
    zero = level == 0;
    chip->eg_silent = level == 0x7f;

    if (chip->eg_state[(chip->cycles+16)%18] != eg_num_attack && (chip->eg_off&2) && !(chip->eg_dokon&2)) {
        next_level = 0x7f;
    }

    if (chip->eg_maxrate && (chip->eg_dokon&2)) {
        next_level = 0x00;
    }


    state = chip->eg_state[(chip->cycles+16)%18];
    next_state = eg_num_attack;

    step = 0;
    sl = chip->eg_sl;

    switch (state) {
    case eg_num_attack:
        if (!chip->eg_maxrate && (chip->eg_kon & 2) && !zero) {
            int32_t shift = (chip->eg_rate_hi < 12) ? chip->eg_inc_lo : (chip->eg_rate_hi - 11 + chip->eg_inc_hi);
            if (shift > 0) {
                step = ~level >> (5 - shift);
            }
        }
        if (zero) {
            next_state = eg_num_decay;
        } else {
            next_state = eg_num_attack;
        }
        break;
    case eg_num_decay:
        if (!(chip->eg_off & 2) && !(chip->eg_dokon & 2) && (level >> 3) != sl)
        {
            uint8_t i0 = chip->eg_rate_hi == 15 || (chip->eg_rate_hi == 14 && chip->eg_inc_hi);
            uint8_t i1 = (chip->eg_rate_hi == 14 && !chip->eg_inc_hi) || (chip->eg_rate_hi == 13 && chip->eg_inc_hi) ||
                (chip->eg_rate_hi == 13 && !chip->eg_inc_hi && (chip->eg_counter_state_prev & 1))
                || (chip->eg_rate_hi == 12 && chip->eg_inc_hi && (chip->eg_counter_state_prev & 1))
                || (chip->eg_rate_hi == 12 && !chip->eg_inc_hi && ((chip->eg_counter_state_prev & 3) == 3))
                || (chip->eg_inc_lo && ((chip->eg_counter_state_prev & 3) == 3));
            step = (i0<<1) | i1;
        }
        if ((level >> 3) == sl) {
            next_state = eg_num_sustain;
        } else {
            next_state = eg_num_decay;
        }
        break;
    case eg_num_sustain:
    case eg_num_release:
        if (!(chip->eg_off & 2) && !(chip->eg_dokon & 2))
        {
            uint8_t i0 = chip->eg_rate_hi == 15 || (chip->eg_rate_hi == 14 && chip->eg_inc_hi);
            uint8_t i1 = (chip->eg_rate_hi == 14 && !chip->eg_inc_hi) || (chip->eg_rate_hi == 13 && chip->eg_inc_hi) ||
                (chip->eg_rate_hi == 13 && !chip->eg_inc_hi && (chip->eg_counter_state_prev & 1))
                || (chip->eg_rate_hi == 12 && chip->eg_inc_hi && (chip->eg_counter_state_prev & 1))
                || (chip->eg_rate_hi == 12 && !chip->eg_inc_hi && ((chip->eg_counter_state_prev & 3) == 3))
                || (chip->eg_inc_lo && ((chip->eg_counter_state_prev & 3) == 3));
            step = (i0<<1) | i1;
        }
        next_state = state;
        break;
    }

    if (!(chip->eg_kon & 2)) {
        next_state = eg_num_release;
    }
    if (chip->eg_dokon & 2) {
        next_state = eg_num_attack;
    }

    chip->eg_level[(chip->cycles+16)%18] = next_level+step;
    chip->eg_state[(chip->cycles+16)%18] = next_state;

    rate_hi = chip->eg_rate >> 2;
    rate_lo = chip->eg_rate & 3;
    chip->eg_inc_hi = eg_stephi[rate_lo][chip->eg_timer_low_lock];
    sum = (chip->eg_timer_shift_lock + rate_hi) & 0x0f;
    chip->eg_inc_lo = 0;
    if (rate_hi < 12 && !chip->eg_zerorate) {
        switch (sum) {
        case 12:
            chip->eg_inc_lo = 1;
            break;
        case 13:
            chip->eg_inc_lo = (rate_lo >> 1) & 1;
            break;
        case 14:
            chip->eg_inc_lo = rate_lo & 1;
            break;
        }
    }
    chip->eg_maxrate = rate_hi == 0x0f;

    chip->eg_rate_hi = rate_hi;

    chip->eg_kon <<= 1;
    chip->eg_kon |= chip->kon[ch_offset[chip->cycles]];
    chip->eg_off <<= 1;
    chip->eg_off |= (chip->eg_level[chip->cycles] >> 2) == 0x1f;
    switch (chip->rm_select) {
    case rm_num_bd0:
    case rm_num_bd1:
        chip->eg_kon |= (chip->rhythm >> 4) & 1;
        break;
    case rm_num_sd:
        chip->eg_kon |= (chip->rhythm >> 3) & 1;
        break;
    case rm_num_tom:
        chip->eg_kon |= (chip->rhythm >> 2) & 1;
        break;
    case rm_num_tc:
        chip->eg_kon |= (chip->rhythm >> 1) & 1;
        break;
    case rm_num_hh:
        chip->eg_kon |= chip->rhythm & 1;
        break;
    }

    /* Calculate rate */
    rate = 0;
    chip->eg_dokon <<= 1;
    state_rate = chip->eg_state[chip->cycles];
    if (state_rate == eg_num_release && (chip->eg_kon&1) && (chip->eg_off&1)) {
        state_rate = eg_num_attack;
        chip->eg_dokon |= 1;
    }
    switch (state_rate) {
    case eg_num_attack:
        rate = chip->c_adrr[0];
        break;
    case eg_num_decay:
        rate = chip->c_adrr[1];
        break;
    case eg_num_sustain:
        if (!chip->c_et) {
            rate = chip->c_adrr[2];
        }
        break;
    case eg_num_release:
        if (chip->son[ch_offset[chip->cycles]]) {
            rate = 5;
        } else {
            rate = chip->c_adrr[2];
        }
        break;
    }
    if (!(chip->eg_kon&1) && !mcsel && chip->rm_select != rm_num_tom && chip->rm_select != rm_num_hh) {
        rate = 0;
    }
    if ((chip->eg_kon&1) && chip->eg_state[chip->cycles] == eg_num_release && !(chip->eg_off&1)) {
        rate = 12;
    }
    if (!(chip->eg_kon&1) && !chip->son[ch_offset[chip->cycles]] && mcsel == 1 && !chip->c_et) {
        rate = 7;
    }
    chip->eg_zerorate = rate == 0;
    ksr = chip->c_ksr_freq;
    if (!chip->c_ksr)
        ksr >>= 2;
    chip->eg_rate = (rate << 2) + ksr;
    if (chip->eg_rate & 0x40) {
        chip->eg_rate = 0x3c | (ksr & 3);
    }
    chip->eg_sl = chip->c_sl;
}